

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O1

_Bool ggml_backend_cpu_device_supports_buft(ggml_backend_dev_t dev,ggml_backend_buffer_type_t buft)

{
  char cVar1;
  pointer ppgVar2;
  bool bVar3;
  
  cVar1 = ggml_backend_buft_is_host(buft);
  bVar3 = true;
  if (cVar1 == '\0') {
    ggml_backend_cpu_get_extra_buffers_type();
    bVar3 = ggml_backend_cpu_get_extra_buffers_type::bufts.
            super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            ggml_backend_cpu_get_extra_buffers_type::bufts.
            super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if ((bVar3) &&
       (ppgVar2 = ggml_backend_cpu_get_extra_buffers_type::bufts.
                  super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
       *ggml_backend_cpu_get_extra_buffers_type::bufts.
        super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
        _M_impl.super__Vector_impl_data._M_start == (ggml_backend_buffer_type *)0x0 ||
       *ggml_backend_cpu_get_extra_buffers_type::bufts.
        super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
        _M_impl.super__Vector_impl_data._M_start != buft)) {
      do {
        ppgVar2 = ppgVar2 + 1;
        bVar3 = ppgVar2 !=
                ggml_backend_cpu_get_extra_buffers_type::bufts.
                super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        if (ppgVar2 ==
            ggml_backend_cpu_get_extra_buffers_type::bufts.
            super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          return bVar3;
        }
      } while (*ppgVar2 != buft || *ppgVar2 == (ggml_backend_buffer_type *)0x0);
    }
  }
  return bVar3;
}

Assistant:

static bool ggml_backend_cpu_device_supports_buft(ggml_backend_dev_t dev, ggml_backend_buffer_type_t buft) {
    return ggml_backend_buft_is_host(buft) || ggml_backend_cpu_is_extra_buffer_type(buft);
    GGML_UNUSED(dev);
}